

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void __thiscall
AssemblyCode::CJumpEqualCommand::CJumpEqualCommand
          (CJumpEqualCommand *this,CTemp *leftOperand,CTemp *rightOperand,string *label)

{
  AbstractJumpCommand::AbstractJumpCommand(&this->super_AbstractJumpCommand,label);
  (this->super_AbstractJumpCommand).super_AssemblyCommand._vptr_AssemblyCommand =
       (_func_int **)&PTR_GetIn_0017ce80;
  std::__cxx11::string::string((string *)&this->leftOperand,(string *)leftOperand);
  std::__cxx11::string::string((string *)&this->rightOperand,(string *)rightOperand);
  return;
}

Assistant:

AssemblyCode::CJumpEqualCommand::CJumpEqualCommand( const IRT::CTemp leftOperand, const IRT::CTemp rightOperand,
                                                    const std::string &label ) : leftOperand( leftOperand ),
                                                                                 rightOperand( rightOperand ),
                                                                                 AbstractJumpCommand( label ) { }